

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O1

void __thiscall gl3cts::PerVertexValidationTest::deinit(PerVertexValidationTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_pipeline_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x450))(1,&this->m_pipeline_id);
    this->m_pipeline_id = 0;
  }
  destroyPOsAndSOs(this);
  return;
}

Assistant:

void PerVertexValidationTest::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Release the pipeline object */
	if (m_pipeline_id != 0)
	{
		gl.deleteProgramPipelines(1, &m_pipeline_id);

		m_pipeline_id = 0;
	}

	/* Release all dangling shader and shader program objects */
	destroyPOsAndSOs();
}